

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::draw(Fl_Text_Display *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Fl_Scrollbar *pFVar6;
  Fl_Scrollbar *pFVar7;
  int iVar8;
  Fl_Color c;
  int iVar9;
  int iVar10;
  Fl_Surface_Device *pFVar11;
  Fl_Surface_Device *pFVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int H;
  int W;
  int end;
  int start;
  
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
    return;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
  iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
  c = (this->super_Fl_Group).super_Fl_Widget.color_;
  if (iVar8 == 0) {
    c = fl_inactive(c);
  }
  uVar15 = (ulong)c;
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.damage_;
  if ((char)bVar1 < '\0') {
    pFVar11 = Fl_Surface_Device::_surface;
    if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
      pFVar11 = Fl_Surface_Device::default_surface();
    }
    pFVar12 = &Fl_Display_Device::display_device()->super_Fl_Surface_Device;
    if (pFVar11 != pFVar12) {
      uVar2 = (this->text_area).x;
      uVar3 = (this->text_area).y;
      uVar4 = (this->text_area).w;
      uVar5 = (this->text_area).h;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,
                        (this->super_Fl_Group).super_Fl_Widget.x_,
                        (this->super_Fl_Group).super_Fl_Widget.y_,
                        (this->super_Fl_Group).super_Fl_Widget.w_,
                        (this->super_Fl_Group).super_Fl_Widget.h_,c);
    iVar8 = (this->text_area).x;
    iVar10 = (this->text_area).y;
    iVar13 = (this->text_area).h;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(iVar8 - 3),(ulong)(iVar10 - 1),3,(ulong)(iVar13 + 2));
    iVar8 = (this->text_area).y;
    iVar10 = (this->text_area).w;
    iVar13 = (this->text_area).x;
    iVar14 = (this->text_area).h;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)(iVar10 + iVar13),(ulong)(iVar8 - 1),3,
               (ulong)(iVar14 + 2));
    uVar2 = (this->text_area).x;
    iVar8 = (this->text_area).y;
    uVar3 = (this->text_area).w;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar2,(ulong)(iVar8 - 1),(ulong)uVar3,1);
    iVar8 = (this->text_area).h;
    iVar10 = (this->text_area).y;
    uVar2 = (this->text_area).x;
    uVar3 = (this->text_area).w;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar2,(ulong)(uint)(iVar8 + iVar10),(ulong)uVar3,1);
    pFVar6 = this->mVScrollBar;
    if ((((pFVar6->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
       (pFVar7 = this->mHScrollBar,
       ((pFVar7->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
      uVar2 = (pFVar6->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
      uVar3 = (pFVar6->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
      uVar4 = (pFVar7->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
      uVar5 = (pFVar7->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x31);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar2,(ulong)uVar4,(ulong)uVar3,(ulong)uVar5);
    }
  }
  else if ((bVar1 & 6) != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)((this->text_area).x - 3),(ulong)(uint)(this->text_area).y,
               (ulong)((this->text_area).w + 6),(ulong)(uint)(this->text_area).h);
    iVar8 = (this->text_area).x;
    uVar2 = this->mCursorOldY;
    uVar3 = this->mMaxsize;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(iVar8 - 3),(ulong)uVar2,3,(ulong)uVar3);
    iVar8 = (this->text_area).w;
    iVar10 = (this->text_area).x;
    uVar2 = this->mCursorOldY;
    uVar3 = this->mMaxsize;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar15);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)(iVar8 + iVar10),(ulong)uVar2,3,(ulong)uVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  if (((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x81) != 0) {
    Fl_Widget::damage((Fl_Widget *)this->mVScrollBar,0x80);
    Fl_Widget::damage((Fl_Widget *)this->mHScrollBar,0x80);
  }
  Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mVScrollBar);
  Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mHScrollBar);
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.damage_;
  if ((bVar1 & 0x82) == 0) {
    if ((bVar1 & 4) != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)(this->text_area).x,
                 (ulong)(uint)(this->text_area).y,(ulong)(uint)(this->text_area).w,
                 (ulong)(uint)(this->text_area).h);
      draw_range(this,this->damage_range1_start,this->damage_range1_end);
      if (this->damage_range2_end != -1) {
        draw_range(this,this->damage_range2_start,this->damage_range2_end);
      }
      this->damage_range1_start = -1;
      this->damage_range1_end = -1;
      this->damage_range2_start = -1;
      this->damage_range2_end = -1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
  }
  else {
    iVar9 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
                      (fl_graphics_driver,(ulong)(uint)(this->text_area).x,
                       (ulong)(uint)(this->text_area).y,(ulong)(uint)(this->text_area).w,
                       (ulong)(uint)(this->text_area).h,&start,&end,&W,&H);
    iVar8 = start;
    iVar10 = end;
    iVar13 = W;
    iVar14 = H;
    if (iVar9 == 0) {
      iVar8 = (this->text_area).x;
      iVar10 = (this->text_area).y;
      iVar13 = (this->text_area).w;
      iVar14 = (this->text_area).h;
    }
    draw_text(this,iVar8,iVar10,iVar13,iVar14);
  }
  iVar8 = Fl_Text_Buffer::selection_position(this->mBuffer,&start,&end);
  if (((((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x86) != 0) &&
      (((iVar8 == 0 || (this->mCursorPos < start || end < this->mCursorPos)) &&
       (this->mCursorOn != 0)))) && ((Fl_Text_Display *)Fl::focus_ == this)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)((this->text_area).x - 3),(ulong)(uint)(this->text_area).y,
               (ulong)((this->text_area).w + 6),(ulong)(uint)(this->text_area).h);
    W = 0;
    H = 0;
    iVar10 = position_to_xy(this,this->mCursorPos,&W,&H);
    iVar8 = H;
    if (iVar10 != 0) {
      draw_cursor(this,W,H);
      this->mCursorOldY = iVar8;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  draw_line_numbers(this,false);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Text_Display::draw(void) {
  // don't even try if there is no associated text buffer!
  if (!buffer()) { draw_box(); return; }

  fl_push_clip(x(),y(),w(),h());	// prevent drawing outside widget area

  // background color -- change if inactive
  Fl_Color bgcolor = active_r() ? color() : fl_inactive(color());

  // draw the non-text, non-scrollbar areas.
  if (damage() & FL_DAMAGE_ALL) {
    //    printf("drawing all (box = %d)\n", box());
    if (Fl_Surface_Device::surface() != Fl_Display_Device::display_device()) {
      // if to printer, draw the background
      fl_rectf(text_area.x, text_area.y, text_area.w, text_area.h, bgcolor);
    }
    // draw the box()
    int W = w(), H = h();
    draw_box(box(), x(), y(), W, H, bgcolor);

    if (mHScrollBar->visible())
      W -= scrollbar_width();
    if (mVScrollBar->visible())
      H -= scrollbar_width();

    // left margin
    fl_rectf(text_area.x-LEFT_MARGIN, text_area.y-TOP_MARGIN,
             LEFT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // right margin
    fl_rectf(text_area.x+text_area.w, text_area.y-TOP_MARGIN,
             RIGHT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // top margin
    fl_rectf(text_area.x, text_area.y-TOP_MARGIN,
             text_area.w, TOP_MARGIN, bgcolor);

    // bottom margin
    fl_rectf(text_area.x, text_area.y+text_area.h,
             text_area.w, BOTTOM_MARGIN, bgcolor);

    // draw that little box in the corner of the scrollbars
    if (mVScrollBar->visible() && mHScrollBar->visible())
      fl_rectf(mVScrollBar->x(), mHScrollBar->y(),
               mVScrollBar->w(), mHScrollBar->h(),
               FL_GRAY);
    //draw_line_numbers(true);		// commented out STR# 2621 / LZA
  }
  else if (damage() & (FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)) {
    //    printf("blanking previous cursor extrusions at Y: %d\n", mCursorOldY);
    // CET - FIXME - save old cursor position instead and just draw side needed?
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);
    fl_rectf(text_area.x-LEFT_MARGIN, mCursorOldY,
             LEFT_MARGIN, mMaxsize, bgcolor);
    fl_rectf(text_area.x+text_area.w, mCursorOldY,
             RIGHT_MARGIN, mMaxsize, bgcolor);
    fl_pop_clip();
  }

  // draw the scrollbars
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_CHILD)) {
    mVScrollBar->damage(FL_DAMAGE_ALL);
    mHScrollBar->damage(FL_DAMAGE_ALL);
  }
  update_child(*mVScrollBar);
  update_child(*mHScrollBar);

  // draw all of the text
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_EXPOSE)) {
    //printf("drawing all text\n");
    int X, Y, W, H;
    if (fl_clip_box(text_area.x, text_area.y, text_area.w, text_area.h,
                    X, Y, W, H)) {
      // Draw text using the intersected clipping box...
      // (this sets the clipping internally)
      draw_text(X, Y, W, H);
    } else {
      // Draw the whole area...
      draw_text(text_area.x, text_area.y, text_area.w, text_area.h);
    }
  }
  else if (damage() & FL_DAMAGE_SCROLL) {
    // draw some lines of text
    fl_push_clip(text_area.x, text_area.y,
                 text_area.w, text_area.h);
    //printf("drawing text from %d to %d\n", damage_range1_start, damage_range1_end);
    draw_range(damage_range1_start, damage_range1_end);
    if (damage_range2_end != -1) {
      //printf("drawing text from %d to %d\n", damage_range2_start, damage_range2_end);
      draw_range(damage_range2_start, damage_range2_end);
    }
    damage_range1_start = damage_range1_end = -1;
    damage_range2_start = damage_range2_end = -1;
    fl_pop_clip();
  }

  // draw the text cursor
  int start, end;
  int has_selection = buffer()->selection_position(&start, &end);
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)
      && (
#ifdef __APPLE__
	  Fl::compose_state ||
#endif
	  !has_selection || mCursorPos < start || mCursorPos > end) &&
      mCursorOn && Fl::focus() == (Fl_Widget*)this ) {
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);

    int X = 0, Y = 0;
    if (position_to_xy(mCursorPos, &X, &Y)) {
      draw_cursor(X, Y);
      mCursorOldY = Y;
    }
    //    else puts("position_to_xy() failed - unable to draw cursor!");
    //printf("drew cursor at pos: %d (%d,%d)\n", mCursorPos, X, Y);
    fl_pop_clip();
  }

  // Important to do this at end of this method, otherwise line numbers
  // will not scroll with the text edit area
  draw_line_numbers(true);
    
  fl_pop_clip();
}